

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrDEC0xce(CPU *this)

{
  Memory *this_00;
  uint8_t uVar1;
  byte value;
  uint16_t uVar2;
  
  uVar2 = this->PC;
  this->PC = uVar2 + 2;
  uVar2 = Memory::Read16(this->m,uVar2);
  this_00 = this->m;
  uVar1 = Memory::Read8(this_00,uVar2);
  value = uVar1 - 1;
  this->field_0x2e = value >> 7 | (value == 0) << 6 | this->field_0x2e & 0xbe;
  Memory::Write8(this_00,uVar2,value);
  return 6;
}

Assistant:

int CPU::instrDEC0xce() {
	uint16_t address = absolute_addr_j();
	m->Write8(address, DEC(m->Read8(address)));
	return 6;
}